

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  _func_int **pp_Var1;
  Expr *pEVar2;
  Result RVar3;
  size_t sVar4;
  pointer pLVar5;
  pointer pLVar6;
  char *pcVar7;
  Expr *expr;
  LabelNode *label;
  Expr *local_28;
  LabelNode *local_20;
  
  pLVar6 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)(((long)pLVar5 - (long)pLVar6 >> 3) * -0x5555555555555555) < 2) goto LAB_0011a60c;
  RVar3 = TopLabelExpr(this,&local_20,&local_28);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_20->label_type) {
  case Block:
    if (local_28->type_ != Block) {
      pcVar7 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_0011a669;
    }
    break;
  case Loop:
    if (local_28->type_ != Loop) {
      pcVar7 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_0011a669;
    }
    break;
  case If:
    if (local_28->type_ != If) {
LAB_0011a63d:
      pcVar7 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0011a669:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,pcVar7);
    }
    break;
  case Else:
    if (local_28->type_ != If) goto LAB_0011a63d;
    pcVar7 = this->filename_;
    sVar4 = strlen(pcVar7);
    pp_Var1 = (_func_int **)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset
    ;
    *(size_t *)((long)&local_28[4].loc.field_1 + 8) = sVar4;
    *(char **)&local_28[4].type_ = pcVar7;
    local_28[5]._vptr_Expr = pp_Var1;
    local_28 = local_28 + 5;
    goto LAB_0011a5fd;
  case Try:
    if (local_28->type_ != Try) {
      pcVar7 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
      goto LAB_0011a669;
    }
    break;
  case TryTable:
    if (local_28->type_ != TryTable) {
      pcVar7 = "Derived *wabt::cast(Base *) [Derived = wabt::TryTableExpr, Base = wabt::Expr]";
      goto LAB_0011a669;
    }
    break;
  default:
    goto switchD_0011a4f4_default;
  }
  pp_Var1 = (_func_int **)this->filename_;
  sVar4 = strlen((char *)pp_Var1);
  pEVar2 = (Expr *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  *(size_t *)&local_28[3].type_ = sVar4;
  local_28[4]._vptr_Expr = pp_Var1;
  local_28[4].super_intrusive_list_base<wabt::Expr>.next_ = pEVar2;
  local_28 = (Expr *)&local_28[4].super_intrusive_list_base<wabt::Expr>;
LAB_0011a5fd:
  *(undefined4 *)&(local_28->super_intrusive_list_base<wabt::Expr>).next_ = 0;
switchD_0011a4f4_default:
  pLVar6 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0011a60c:
  if (pLVar5 == pLVar6) {
    PrintError(this,"popping empty label stack");
    return (Result)Error;
  }
  (this->label_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = pLVar5 + -1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  if (label_stack_.size() > 1) {
    LabelNode* label;
    Expr* expr;
    CHECK_RESULT(TopLabelExpr(&label, &expr));
    switch (label->label_type) {
      case LabelType::Block:
        cast<BlockExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::Loop:
        cast<LoopExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::If:
        cast<IfExpr>(expr)->true_.end_loc = GetLocation();
        break;
      case LabelType::Else:
        cast<IfExpr>(expr)->false_end_loc = GetLocation();
        break;
      case LabelType::Try:
        cast<TryExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::TryTable:
        cast<TryTableExpr>(expr)->block.end_loc = GetLocation();
        break;

      case LabelType::InitExpr:
      case LabelType::Func:
      case LabelType::Catch:
        break;
    }
  }

  return PopLabel();
}